

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLUtil.cpp
# Opt level: O0

EGLConfig eglu::chooseConfig(Library *egl,EGLDisplay display,RenderConfig *config)

{
  void *pvVar1;
  bool bVar2;
  reference ppvVar3;
  NotSupportedError *this;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> local_48;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> local_40;
  const_iterator iter;
  vector<void_*,_std::allocator<void_*>_> configs;
  RenderConfig *config_local;
  EGLDisplay display_local;
  Library *egl_local;
  
  getConfigs((vector<void_*,_std::allocator<void_*>_> *)&iter,egl,display);
  local_40._M_current =
       (void **)std::vector<void_*,_std::allocator<void_*>_>::begin
                          ((vector<void_*,_std::allocator<void_*>_> *)&iter);
  while( true ) {
    local_48._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::end
                            ((vector<void_*,_std::allocator<void_*>_> *)&iter);
    bVar2 = __gnu_cxx::operator!=(&local_40,&local_48);
    if (!bVar2) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"Matching EGL config not found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                 ,0x108);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
      ;
    }
    ppvVar3 = __gnu_cxx::
              __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
              operator*(&local_40);
    bVar2 = configMatches(egl,display,*ppvVar3,config);
    if (bVar2) break;
    __gnu_cxx::__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
    operator++(&local_40);
  }
  ppvVar3 = __gnu_cxx::
            __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
            operator*(&local_40);
  pvVar1 = *ppvVar3;
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)&iter);
  return pvVar1;
}

Assistant:

EGLConfig chooseConfig (const Library& egl, EGLDisplay display, const glu::RenderConfig& config)
{
	const std::vector<EGLConfig> configs = eglu::getConfigs(egl, display);

	for (vector<EGLConfig>::const_iterator iter = configs.begin(); iter != configs.end(); ++iter)
	{
		if (configMatches(egl, display, *iter, config))
			return *iter;
	}

	throw tcu::NotSupportedError("Matching EGL config not found", DE_NULL, __FILE__, __LINE__);
}